

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

FT_Bool FT_Get_Color_Glyph_Layer
                  (FT_Face face,FT_UInt base_glyph,FT_UInt *aglyph_index,FT_UInt *acolor_index,
                  FT_LayerIterator *iterator)

{
  code *UNRECOVERED_JUMPTABLE;
  FT_Bool FVar1;
  undefined4 in_EAX;
  int iVar2;
  undefined1 auVar3 [16];
  
  auVar3._0_4_ = -(uint)(face == (FT_Face)0x0);
  auVar3._4_4_ = -(uint)(aglyph_index == (FT_UInt *)0x0);
  auVar3._8_4_ = -(uint)(acolor_index == (FT_UInt *)0x0);
  auVar3._12_4_ = -(uint)(iterator == (FT_LayerIterator *)0x0);
  iVar2 = movmskps(in_EAX,auVar3);
  if ((((iVar2 == 0) && (base_glyph < (uint)face->num_glyphs)) && ((face->face_flags & 8) != 0)) &&
     (UNRECOVERED_JUMPTABLE = *(code **)(*(long *)&face[3].units_per_EM + 0x108),
     UNRECOVERED_JUMPTABLE != (code *)0x0)) {
    FVar1 = (*UNRECOVERED_JUMPTABLE)();
    return FVar1;
  }
  return '\0';
}

Assistant:

FT_EXPORT_DEF( FT_Bool )
  FT_Get_Color_Glyph_Layer( FT_Face            face,
                            FT_UInt            base_glyph,
                            FT_UInt           *aglyph_index,
                            FT_UInt           *acolor_index,
                            FT_LayerIterator*  iterator )
  {
    TT_Face       ttface;
    SFNT_Service  sfnt;


    if ( !face                                   ||
         !aglyph_index                           ||
         !acolor_index                           ||
         !iterator                               ||
         base_glyph >= (FT_UInt)face->num_glyphs )
      return 0;

    if ( !FT_IS_SFNT( face ) )
      return 0;

    ttface = (TT_Face)face;
    sfnt   = (SFNT_Service)ttface->sfnt;

    if ( sfnt->get_colr_layer )
      return sfnt->get_colr_layer( ttface,
                                   base_glyph,
                                   aglyph_index,
                                   acolor_index,
                                   iterator );
    else
      return 0;
  }